

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O2

void helics::loadOptions<toml::basic_value<toml::type_config>>
               (MessageFederate *fed,basic_value<toml::type_config> *data,Endpoint *ept)

{
  pointer pbVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *peVar6;
  array_type *paVar7;
  string_type *psVar8;
  enable_if_t<detail::is_exact_toml_type<basic_string<char>,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<basic_string<char,_char_traits<char>,_allocator<char>_>_>_&>
  pbVar9;
  ulong in_R9;
  basic_value<toml::type_config> *target;
  pointer pbVar10;
  string_view info_00;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view filterName;
  string_view filterName_00;
  string_view filterName_01;
  string_view filterName_02;
  string_view filterName_03;
  string_view filterName_04;
  string_view target_00;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> targets;
  string info;
  string defTarget;
  allocator<char> local_38a;
  allocator<char> local_389;
  _Any_data local_388;
  undefined1 local_378 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  undefined1 local_348 [16];
  code *local_338;
  code *local_330;
  string local_278;
  undefined1 local_258 [16];
  code *local_248;
  code *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"flags",(allocator<char> *)(local_378 + 0x10));
  local_278._M_dataplus._M_p = (pointer)ept;
  local_278._M_string_length = (size_type)fed;
  toml::basic_value<toml::type_config>::basic_value((basic_value<toml::type_config> *)local_258);
  peVar6 = toml::find_or<toml::type_config,std::__cxx11::string>
                     (data,&local_130,(basic_value<toml::type_config> *)local_258);
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)local_348,peVar6);
  if (local_348[0] != empty) {
    if (local_348[0] == array) {
      paVar7 = toml::basic_value<toml::type_config>::as_array
                         ((basic_value<toml::type_config> *)local_348);
      pbVar1 = (paVar7->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar10 = (paVar7->
                     super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar1;
          pbVar10 = pbVar10 + 1) {
        psVar8 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar10);
        loadOptions<toml::basic_value<toml::type_config>_>::anon_class_16_2_44194f65::operator()
                  ((anon_class_16_2_44194f65 *)&local_278,psVar8);
      }
    }
    else {
      psVar8 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                         ((basic_value<toml::type_config> *)local_348);
      loadOptions<toml::basic_value<toml::type_config>_>::anon_class_16_2_44194f65::operator()
                ((anon_class_16_2_44194f65 *)&local_278,psVar8);
    }
  }
  if (local_130._M_dataplus._M_p[local_130._M_string_length - 1] == 's') {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (&local_130);
    local_388._M_unused._M_object = local_378;
    local_388._8_8_ = 0;
    local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
    pbVar9 = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                       (data,&local_130,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_388);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_388,
               pbVar9);
    if (local_388._8_8_ != 0) {
      loadOptions<toml::basic_value<toml::type_config>_>::anon_class_16_2_44194f65::operator()
                ((anon_class_16_2_44194f65 *)&local_278,(string *)&local_388);
    }
    std::__cxx11::string::~string((string *)local_388._M_pod_data);
  }
  toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)local_348);
  toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)local_258);
  std::__cxx11::string::~string((string *)&local_130);
  local_258._0_8_ = (void *)0x0;
  local_258._8_8_ = 0;
  local_240 = std::
              _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/MessageFederate.cpp:191:9)>
              ::_M_invoke;
  local_248 = std::
              _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/MessageFederate.cpp:191:9)>
              ::_M_manager;
  local_348._0_8_ = (void *)0x0;
  local_348._8_8_ = 0;
  local_330 = std::
              _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/MessageFederate.cpp:192:9)>
              ::_M_invoke;
  local_338 = std::
              _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/MessageFederate.cpp:192:9)>
              ::_M_manager;
  local_388._8_8_ = 0;
  local_378._8_8_ =
       std::
       _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/MessageFederate.cpp:193:9)>
       ::_M_invoke;
  local_378._0_8_ =
       std::
       _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/MessageFederate.cpp:193:9)>
       ::_M_manager;
  local_388._M_unused._M_object = ept;
  processOptions(data,(function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)local_258,
                 (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)local_348,(function<void_(int,_int)> *)&local_388);
  std::_Function_base::~_Function_base((_Function_base *)&local_388);
  std::_Function_base::~_Function_base((_Function_base *)local_348);
  std::_Function_base::~_Function_base((_Function_base *)local_258);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_258,"info",(allocator<char> *)local_348);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_R9;
  fileops::getOrDefault
            (&local_278,(fileops *)data,(value *)local_258,(string *)0x0,
             (string_view)(auVar2 << 0x40));
  std::__cxx11::string::~string((string *)local_258);
  if ((MessageFederate *)local_278._M_string_length != (MessageFederate *)0x0) {
    info_00._M_str = local_278._M_dataplus._M_p;
    info_00._M_len = local_278._M_string_length;
    Interface::setInfo(&ept->super_Interface,info_00);
  }
  local_258._8_8_ = 0;
  local_240 = std::
              _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/MessageFederate.cpp:199:20)>
              ::_M_invoke;
  local_248 = std::
              _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/MessageFederate.cpp:199:20)>
              ::_M_manager;
  local_258._0_8_ = ept;
  loadTags(data,(function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                 *)local_258);
  std::_Function_base::~_Function_base((_Function_base *)local_258);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"subscriptions",(allocator<char> *)(local_378 + 0x10));
  toml::basic_value<toml::type_config>::basic_value((basic_value<toml::type_config> *)local_258);
  peVar6 = toml::find_or<toml::type_config,std::__cxx11::string>
                     (data,&local_150,(basic_value<toml::type_config> *)local_258);
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)local_348,peVar6);
  if (local_348[0] != empty) {
    if (local_348[0] == array) {
      paVar7 = toml::basic_value<toml::type_config>::as_array
                         ((basic_value<toml::type_config> *)local_348);
      pbVar1 = (paVar7->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar10 = (paVar7->
                     super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar1;
          pbVar10 = pbVar10 + 1) {
        psVar8 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar10);
        key._M_str = (psVar8->_M_dataplus)._M_p;
        key._M_len = psVar8->_M_string_length;
        Endpoint::subscribe(ept,key);
      }
    }
    else {
      psVar8 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                         ((basic_value<toml::type_config> *)local_348);
      key_00._M_str = (psVar8->_M_dataplus)._M_p;
      key_00._M_len = psVar8->_M_string_length;
      Endpoint::subscribe(ept,key_00);
    }
  }
  if (local_150._M_dataplus._M_p[local_150._M_string_length - 1] == 's') {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (&local_150);
    local_388._M_unused._M_object = local_378;
    local_388._8_8_ = 0;
    local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
    pbVar9 = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                       (data,&local_150,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_388);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_388,
               pbVar9);
    if (local_388._8_8_ != 0) {
      key_01._M_str = (char *)local_388._M_unused._0_8_;
      key_01._M_len = local_388._8_8_;
      Endpoint::subscribe(ept,key_01);
    }
    std::__cxx11::string::~string((string *)local_388._M_pod_data);
  }
  toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)local_348);
  toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)local_258);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"filters",(allocator<char> *)(local_378 + 0x10));
  toml::basic_value<toml::type_config>::basic_value((basic_value<toml::type_config> *)local_258);
  peVar6 = toml::find_or<toml::type_config,std::__cxx11::string>
                     (data,&local_170,(basic_value<toml::type_config> *)local_258);
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)local_348,peVar6);
  if (local_348[0] != empty) {
    if (local_348[0] == array) {
      paVar7 = toml::basic_value<toml::type_config>::as_array
                         ((basic_value<toml::type_config> *)local_348);
      pbVar1 = (paVar7->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar10 = (paVar7->
                     super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar1;
          pbVar10 = pbVar10 + 1) {
        psVar8 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar10);
        filterName._M_str = (psVar8->_M_dataplus)._M_p;
        filterName._M_len = psVar8->_M_string_length;
        Endpoint::addSourceFilter(ept,filterName);
      }
    }
    else {
      psVar8 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                         ((basic_value<toml::type_config> *)local_348);
      filterName_00._M_str = (psVar8->_M_dataplus)._M_p;
      filterName_00._M_len = psVar8->_M_string_length;
      Endpoint::addSourceFilter(ept,filterName_00);
    }
  }
  if (local_170._M_dataplus._M_p[local_170._M_string_length - 1] == 's') {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (&local_170);
    local_388._M_unused._M_object = local_378;
    local_388._8_8_ = 0;
    local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
    pbVar9 = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                       (data,&local_170,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_388);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_388,
               pbVar9);
    if (local_388._8_8_ != 0) {
      filterName_01._M_str = (char *)local_388._M_unused._0_8_;
      filterName_01._M_len = local_388._8_8_;
      Endpoint::addSourceFilter(ept,filterName_01);
    }
    std::__cxx11::string::~string((string *)local_388._M_pod_data);
  }
  toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)local_348);
  toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)local_258);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_378 + 0x10),"source",&local_389);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"inputs",&local_38a);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_378 + 0x10),"_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 &local_50);
  bVar4 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_3_>
                    (data,(string *)local_258,(anon_class_8_1_ba1d4489)ept);
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::string::~string((string *)local_348);
  if (!bVar4) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_378 + 0x10),&local_50);
    bVar4 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_3_>
                      (data,(string *)local_348,(anon_class_8_1_ba1d4489)ept);
    std::__cxx11::string::~string((string *)local_348);
    if (!bVar4) {
      iVar5 = toupper((int)*local_50._M_dataplus._M_p);
      *local_50._M_dataplus._M_p = (char)iVar5;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_388
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_378 + 0x10),&local_50);
      addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_3_>
                (data,(string *)&local_388,(anon_class_8_1_ba1d4489)ept);
      std::__cxx11::string::~string((string *)local_388._M_pod_data);
    }
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)(local_378 + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_378 + 0x10),"source",&local_389);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"filters",&local_38a);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_378 + 0x10),"_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 &local_70);
  bVar4 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_4_>
                    (data,(string *)local_258,(anon_class_8_1_ba1d4489)ept);
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::string::~string((string *)local_348);
  if (!bVar4) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_378 + 0x10),&local_70);
    bVar4 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_4_>
                      (data,(string *)local_348,(anon_class_8_1_ba1d4489)ept);
    std::__cxx11::string::~string((string *)local_348);
    if (!bVar4) {
      iVar5 = toupper((int)*local_70._M_dataplus._M_p);
      *local_70._M_dataplus._M_p = (char)iVar5;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_388
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_378 + 0x10),&local_70);
      addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_4_>
                (data,(string *)&local_388,(anon_class_8_1_ba1d4489)ept);
      std::__cxx11::string::~string((string *)local_388._M_pod_data);
    }
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)(local_378 + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_378 + 0x10),"destination",&local_389);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"filters",&local_38a);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_378 + 0x10),"_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 &local_90);
  bVar4 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_5_>
                    (data,(string *)local_258,(anon_class_8_1_ba1d4489)ept);
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::string::~string((string *)local_348);
  if (!bVar4) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_378 + 0x10),&local_90);
    bVar4 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_5_>
                      (data,(string *)local_348,(anon_class_8_1_ba1d4489)ept);
    std::__cxx11::string::~string((string *)local_348);
    if (!bVar4) {
      iVar5 = toupper((int)*local_90._M_dataplus._M_p);
      *local_90._M_dataplus._M_p = (char)iVar5;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_388
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_378 + 0x10),&local_90);
      addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_5_>
                (data,(string *)&local_388,(anon_class_8_1_ba1d4489)ept);
      std::__cxx11::string::~string((string *)local_388._M_pod_data);
    }
  }
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)(local_378 + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_378 + 0x10),"source",&local_389);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"endpoints",&local_38a);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_378 + 0x10),"_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 &local_b0);
  bVar4 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_6_>
                    (data,(string *)local_258,(anon_class_8_1_ba1d4489)ept);
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::string::~string((string *)local_348);
  if (!bVar4) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_378 + 0x10),&local_b0);
    bVar4 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_6_>
                      (data,(string *)local_348,(anon_class_8_1_ba1d4489)ept);
    std::__cxx11::string::~string((string *)local_348);
    if (!bVar4) {
      iVar5 = toupper((int)*local_b0._M_dataplus._M_p);
      *local_b0._M_dataplus._M_p = (char)iVar5;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_388
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_378 + 0x10),&local_b0);
      addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_6_>
                (data,(string *)&local_388,(anon_class_8_1_ba1d4489)ept);
      std::__cxx11::string::~string((string *)local_388._M_pod_data);
    }
  }
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)(local_378 + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_378 + 0x10),"destination",&local_389);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"endpoints",&local_38a);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_378 + 0x10),"_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 &local_d0);
  bVar4 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_7_>
                    (data,(string *)local_258,(anon_class_8_1_ba1d4489)ept);
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::string::~string((string *)local_348);
  if (!bVar4) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_378 + 0x10),&local_d0);
    bVar4 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_7_>
                      (data,(string *)local_348,(anon_class_8_1_ba1d4489)ept);
    std::__cxx11::string::~string((string *)local_348);
    if (!bVar4) {
      iVar5 = toupper((int)*local_d0._M_dataplus._M_p);
      *local_d0._M_dataplus._M_p = (char)iVar5;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_388
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_378 + 0x10),&local_d0);
      addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_7_>
                (data,(string *)&local_388,(anon_class_8_1_ba1d4489)ept);
      std::__cxx11::string::~string((string *)local_388._M_pod_data);
    }
  }
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)(local_378 + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_378 + 0x10),"source",&local_389);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"targets",&local_38a);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_378 + 0x10),"_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 &local_f0);
  bVar4 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_8_>
                    (data,(string *)local_258,(anon_class_8_1_ba1d4489)ept);
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::string::~string((string *)local_348);
  if (!bVar4) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_378 + 0x10),&local_f0);
    bVar4 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_8_>
                      (data,(string *)local_348,(anon_class_8_1_ba1d4489)ept);
    std::__cxx11::string::~string((string *)local_348);
    if (!bVar4) {
      iVar5 = toupper((int)*local_f0._M_dataplus._M_p);
      *local_f0._M_dataplus._M_p = (char)iVar5;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_388
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_378 + 0x10),&local_f0);
      addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_8_>
                (data,(string *)&local_388,(anon_class_8_1_ba1d4489)ept);
      std::__cxx11::string::~string((string *)local_388._M_pod_data);
    }
  }
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)(local_378 + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_378 + 0x10),"destination",&local_389);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"targets",&local_38a);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_378 + 0x10),"_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 &local_110);
  bVar4 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_9_>
                    (data,(string *)local_258,(anon_class_8_1_ba1d4489)ept);
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::string::~string((string *)local_348);
  if (!bVar4) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_378 + 0x10),&local_110);
    bVar4 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_9_>
                      (data,(string *)local_348,(anon_class_8_1_ba1d4489)ept);
    std::__cxx11::string::~string((string *)local_348);
    if (!bVar4) {
      iVar5 = toupper((int)*local_110._M_dataplus._M_p);
      *local_110._M_dataplus._M_p = (char)iVar5;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_388
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_378 + 0x10),&local_110);
      addTargets<helics::loadOptions<toml::basic_value<toml::type_config>>(helics::MessageFederate*,toml::basic_value<toml::type_config>const&,helics::Endpoint&)::_lambda(std::basic_string_view<char,std::char_traits<char>>)_9_>
                (data,(string *)&local_388,(anon_class_8_1_ba1d4489)ept);
      std::__cxx11::string::~string((string *)local_388._M_pod_data);
    }
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)(local_378 + 0x10));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"destFilters",(allocator<char> *)(local_378 + 0x10));
  toml::basic_value<toml::type_config>::basic_value((basic_value<toml::type_config> *)local_258);
  peVar6 = toml::find_or<toml::type_config,std::__cxx11::string>
                     (data,&local_190,(basic_value<toml::type_config> *)local_258);
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)local_348,peVar6);
  if (local_348[0] != empty) {
    if (local_348[0] == array) {
      paVar7 = toml::basic_value<toml::type_config>::as_array
                         ((basic_value<toml::type_config> *)local_348);
      pbVar1 = (paVar7->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar10 = (paVar7->
                     super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar1;
          pbVar10 = pbVar10 + 1) {
        psVar8 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar10);
        filterName_02._M_str = (psVar8->_M_dataplus)._M_p;
        filterName_02._M_len = psVar8->_M_string_length;
        Endpoint::addDestinationFilter(ept,filterName_02);
      }
    }
    else {
      psVar8 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                         ((basic_value<toml::type_config> *)local_348);
      filterName_03._M_str = (psVar8->_M_dataplus)._M_p;
      filterName_03._M_len = psVar8->_M_string_length;
      Endpoint::addDestinationFilter(ept,filterName_03);
    }
  }
  if (local_190._M_dataplus._M_p[local_190._M_string_length - 1] == 's') {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (&local_190);
    local_388._M_unused._M_object = local_378;
    local_388._8_8_ = 0;
    local_378._0_8_ = local_378._0_8_ & 0xffffffffffffff00;
    pbVar9 = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                       (data,&local_190,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_388);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_388,
               pbVar9);
    if (local_388._8_8_ != 0) {
      filterName_04._M_str = (char *)local_388._M_unused._0_8_;
      filterName_04._M_len = local_388._8_8_;
      Endpoint::addDestinationFilter(ept,filterName_04);
    }
    std::__cxx11::string::~string((string *)local_388._M_pod_data);
  }
  toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)local_348);
  toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)local_258);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_348,"target",(allocator<char> *)local_388._M_pod_data);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = in_R9;
  fileops::getOrDefault
            ((string *)local_258,(fileops *)data,(value *)local_348,(string *)0x0,
             (string_view)(auVar3 << 0x40));
  std::__cxx11::string::~string((string *)local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_348,"destination",(allocator<char> *)local_388._M_pod_data);
  fileops::replaceIfMember(data,(string *)local_348,(string *)local_258);
  std::__cxx11::string::~string((string *)local_348);
  if (local_258._8_8_ != 0) {
    target_00._M_str = (char *)local_258._0_8_;
    target_00._M_len = local_258._8_8_;
    Endpoint::setDefaultDestination(ept,target_00);
  }
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::string::~string((string *)&local_278);
  return;
}

Assistant:

static void loadOptions(MessageFederate* fed, const Inp& data, Endpoint& ept)
{
    using fileops::getOrDefault;
    addTargets(data, "flags", [&ept, fed](const std::string& target) {
        auto oindex = getOptionIndex((target.front() != '-') ? target : target.substr(1));
        const int val = (target.front() != '-') ? 1 : 0;
        if (oindex == HELICS_INVALID_OPTION_INDEX) {
            fed->logWarningMessage(target + " is not a recognized flag");
            return;
        }
        ept.setOption(oindex, val);
    });
    processOptions(
        data,
        [](const std::string& option) { return getOptionIndex(option); },
        [](const std::string& value) { return getOptionValue(value); },
        [&ept](int32_t option, int32_t value) { ept.setOption(option, value); });

    auto info = getOrDefault(data, "info", emptyStr);
    if (!info.empty()) {
        ept.setInfo(info);
    }
    loadTags(data, [&ept](std::string_view tagname, std::string_view tagvalue) {
        ept.setTag(tagname, tagvalue);
    });
    addTargets(data, "subscriptions", [&ept](std::string_view sub) { ept.subscribe(sub); });
    addTargets(data, "filters", [&ept](std::string_view filt) { ept.addSourceFilter(filt); });
    addTargetVariations(data, "source", "inputs", [&ept](std::string_view ipt) {
        ept.subscribe(ipt);
    });
    addTargetVariations(data, "source", "filters", [&ept](std::string_view filt) {
        ept.addSourceFilter(filt);
    });
    addTargetVariations(data, "destination", "filters", [&ept](std::string_view filt) {
        ept.addDestinationFilter(filt);
    });
    addTargetVariations(data, "source", "endpoints", [&ept](std::string_view endpoint) {
        ept.addSourceEndpoint(endpoint);
    });
    addTargetVariations(data, "destination", "endpoints", [&ept](std::string_view endpoint) {
        ept.addDestinationEndpoint(endpoint);
    });
    addTargetVariations(data, "source", "targets", [&ept](std::string_view endpoint) {
        ept.addSourceEndpoint(endpoint);
    });
    addTargetVariations(data, "destination", "targets", [&ept](std::string_view endpoint) {
        ept.addDestinationEndpoint(endpoint);
    });
    addTargets(data, "destFilters", [&ept](std::string_view filt) {
        ept.addDestinationFilter(filt);
    });

    auto defTarget = fileops::getOrDefault(data, "target", emptyStr);
    fileops::replaceIfMember(data, "destination", defTarget);
    if (!defTarget.empty()) {
        ept.setDefaultDestination(defTarget);
    }
}